

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

int __thiscall RenX::Server::sendMessage(Server *this,string_view message)

{
  int iVar1;
  char *in_RCX;
  int iVar2;
  _List_node_base *p_Var3;
  string_view text;
  string_view text_00;
  string_view str;
  string local_b0;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  str._M_len = message._M_str;
  str._M_str = in_RCX;
  escapifyRCON_abi_cxx11_(&msg,(RenX *)message._M_len,str);
  if (this->m_neverSay == true) {
    if ((this->players).super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>.
        _M_impl._M_node._M_size == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      p_Var3 = (_List_node_base *)&this->players;
      while (p_Var3 = (((_List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                       &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var3 != (_List_node_base *)&this->players) {
        if (*(char *)(p_Var3 + 0x10 + 1) == '\0') {
          string_printf_abi_cxx11_
                    (&local_b0,"chostprivatesay pid%d %.*s\n",
                     (ulong)*(uint *)((long)&p_Var3[0x10]._M_prev + 4),msg._M_string_length,
                     msg._M_dataplus._M_p);
          text._M_str = local_b0._M_dataplus._M_p;
          text._M_len = local_b0._M_string_length;
          iVar1 = sendSocket(this,text);
          iVar2 = iVar2 + iVar1;
          std::__cxx11::string::~string((string *)&local_b0);
        }
      }
    }
  }
  else {
    s_abi_cxx11_(&local_70,"chostsay ",9);
    std::operator+(&local_50,&local_70,&msg);
    std::operator+(&local_b0,&local_50,'\n');
    text_00._M_str = local_b0._M_dataplus._M_p;
    text_00._M_len = local_b0._M_string_length;
    iVar2 = sendSocket(this,text_00);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&msg);
  return iVar2;
}

Assistant:

int RenX::Server::sendMessage(std::string_view message) {
	std::string msg = RenX::escapifyRCON(message);
	if (m_neverSay) {
		int result = 0;
		if (this->players.size() != 0) {
			for (auto node = this->players.begin(); node != this->players.end(); ++node) {
				if (node->isBot == false) {
					result += sendSocket(string_printf("chostprivatesay pid%d %.*s\n", node->id, msg.size(),
						msg.data()));
				}
			}
		}
		return result;
	}

	return sendSocket("chostsay "s + msg + '\n');
}